

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int biseqcaselessblk(const_bstring b,void *blk,int len)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  __int32_t **pp_Var5;
  ulong uVar6;
  ulong uVar7;
  
  iVar4 = -1;
  if (((b != (const_bstring)0x0) && (puVar3 = b->data, iVar4 = -1, puVar3 != (uchar *)0x0)) &&
     (-1 < (b->slen | len) && blk != (void *)0x0)) {
    if (b->slen == len) {
      iVar4 = 1;
      if (puVar3 != (uchar *)blk && len != 0) {
        uVar6 = 0;
        uVar7 = (ulong)(uint)len;
        if (len < 1) {
          uVar7 = uVar6;
        }
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          bVar1 = puVar3[uVar6];
          bVar2 = *(byte *)((long)blk + uVar6);
          if ((bVar1 != bVar2) &&
             (pp_Var5 = __ctype_tolower_loc(), (char)(*pp_Var5)[bVar2] != (char)(*pp_Var5)[bVar1]))
          goto LAB_001455eb;
        }
        iVar4 = 1;
      }
    }
    else {
LAB_001455eb:
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int biseqcaselessblk (const_bstring b, const void * blk, int len) {
int i;

	if (bdata (b) == NULL || b->slen < 0 ||
	    blk == NULL || len < 0) return BSTR_ERR;
	if (b->slen != len) return 0;
	if (len == 0 || b->data == blk) return 1;
	for (i=0; i < len; i++) {
		if (b->data[i] != ((unsigned char*)blk)[i]) {
			unsigned char c = (unsigned char) downcase (b->data[i]);
			if (c != (unsigned char) downcase (((unsigned char*)blk)[i]))
				return 0;
		}
	}
	return 1;
}